

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O0

PublicationObject *
anon_unknown.dwarf_5d1c2::verifyPublication(HelicsPublication pub,HelicsError *err)

{
  HelicsError *in_RSI;
  PublicationObject *in_RDI;
  PublicationObject *pubObj;
  PublicationObject *local_8;
  
  if ((in_RSI == (HelicsError *)0x0) || (in_RSI->error_code == 0)) {
    if (in_RDI == (PublicationObject *)0x0) {
      assignError(in_RSI,-3,"The given publication object does not point to a valid object");
      local_8 = (PublicationObject *)0x0;
    }
    else {
      local_8 = in_RDI;
      if (in_RDI->valid != -0x684eff5b) {
        assignError(in_RSI,-3,"The given publication object does not point to a valid object");
        local_8 = (PublicationObject *)0x0;
      }
    }
  }
  else {
    local_8 = (PublicationObject *)0x0;
  }
  return local_8;
}

Assistant:

helics::PublicationObject* verifyPublication(HelicsPublication pub, HelicsError* err)
{
    HELICS_ERROR_CHECK(err, nullptr);
    if (pub == nullptr) {
        assignError(err, HELICS_ERROR_INVALID_OBJECT, invalidPublicationString);
        return nullptr;
    }
    auto* pubObj = reinterpret_cast<helics::PublicationObject*>(pub);
    if (pubObj->valid != PublicationValidationIdentifier) {
        assignError(err, HELICS_ERROR_INVALID_OBJECT, invalidPublicationString);
        return nullptr;
    }
    return pubObj;
}